

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu.c
# Opt level: O0

uint8_t mmu_read(gb_mmu_t *mmu,uint16_t addr)

{
  gb *pgVar1;
  uint8_t uVar2;
  ushort uVar3;
  gb_t *gb;
  uint16_t addr_local;
  gb_mmu_t *mmu_local;
  
  if (mmu == (gb_mmu_t *)0x0) {
    __assert_fail("mmu != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/mmu.c"
                  ,0x5a,"uint8_t mmu_read(gb_mmu_t *, uint16_t)");
  }
  pgVar1 = mmu->gb;
  uVar3 = addr & 0xf000;
  if (((((((addr & 0xf000) != 0) && (uVar3 != 0x1000)) && (uVar3 != 0x2000)) &&
       ((uVar3 != 0x3000 && (uVar3 != 0x4000)))) && (uVar3 != 0x5000)) &&
     ((uVar3 != 0x6000 && (uVar3 != 0x7000)))) {
    if ((uVar3 == 0x8000) || (uVar3 == 0x9000)) {
      uVar2 = ppu_vram_read(&pgVar1->ppu,addr);
      return uVar2;
    }
    if ((uVar3 != 0xa000) && (uVar3 != 0xb000)) {
      if ((uVar3 == 0xc000) || (uVar3 == 0xd000)) {
        return mmu->ram[(int)(addr - 0xc000)];
      }
      if (uVar3 == 0xe000) {
        return 0xff;
      }
      if (uVar3 != 0xf000) {
        return 0xff;
      }
      uVar3 = addr & 0xf00;
      if (((((((addr & 0xf00) == 0) || (uVar3 == 0x100)) || (uVar3 == 0x200)) ||
           (((uVar3 == 0x300 || (uVar3 == 0x400)) ||
            ((uVar3 == 0x500 || ((uVar3 == 0x600 || (uVar3 == 0x700)))))))) || (uVar3 == 0x800)) ||
         ((((uVar3 == 0x900 || (uVar3 == 0xa00)) || (uVar3 == 0xb00)) ||
          ((uVar3 == 0xc00 || (uVar3 == 0xd00)))))) {
        return 0xff;
      }
      if (uVar3 == 0xe00) {
        if (0xfe9f < addr) {
          return 0xff;
        }
        uVar2 = ppu_oam_read(&pgVar1->ppu,addr);
        return uVar2;
      }
      if (uVar3 != 0xf00) {
        return 0xff;
      }
      gb._6_1_ = (char)addr;
      if (gb._6_1_ == '\0') {
        uVar2 = joypad_joyp_read(&pgVar1->joypad);
        return uVar2;
      }
      if (gb._6_1_ == '\x04') {
        uVar2 = timer_div_read(&pgVar1->timer);
        return uVar2;
      }
      if (gb._6_1_ == '\x05') {
        uVar2 = timer_tima_read(&pgVar1->timer);
        return uVar2;
      }
      if (gb._6_1_ == '\x06') {
        uVar2 = timer_tma_read(&pgVar1->timer);
        return uVar2;
      }
      if (gb._6_1_ == '\a') {
        uVar2 = timer_tac_read(&pgVar1->timer);
        return uVar2;
      }
      if (gb._6_1_ == '\x0f') {
        uVar2 = int_if_read(&pgVar1->intr_ctrl);
        return uVar2;
      }
      if (gb._6_1_ == '@') {
        uVar2 = ppu_lcdc_read(&pgVar1->ppu);
        return uVar2;
      }
      if (gb._6_1_ != 'A') {
        if (gb._6_1_ == 'B') {
          uVar2 = ppu_scy_read(&pgVar1->ppu);
          return uVar2;
        }
        if (gb._6_1_ == 'C') {
          uVar2 = ppu_scx_read(&pgVar1->ppu);
          return uVar2;
        }
        if (gb._6_1_ == 'D') {
          uVar2 = ppu_ly_read(&pgVar1->ppu);
          return uVar2;
        }
        if (gb._6_1_ == 'E') {
          uVar2 = ppu_lyc_read(&pgVar1->ppu);
          return uVar2;
        }
        if (gb._6_1_ == 'F') {
          uVar2 = ppu_dma_read(&pgVar1->ppu);
          return uVar2;
        }
        if (gb._6_1_ == 'G') {
          uVar2 = ppu_bgp_read(&pgVar1->ppu);
          return uVar2;
        }
        if (gb._6_1_ == 'H') {
          uVar2 = ppu_obp0_read(&pgVar1->ppu);
          return uVar2;
        }
        if (gb._6_1_ != 'I') {
          if (gb._6_1_ == 'J') {
            uVar2 = ppu_wy_read(&pgVar1->ppu);
            return uVar2;
          }
          if (gb._6_1_ == 'K') {
            uVar2 = ppu_wx_read(&pgVar1->ppu);
            return uVar2;
          }
          if (gb._6_1_ == -1) {
            uVar2 = int_ie_read(&pgVar1->intr_ctrl);
            return uVar2;
          }
          if ((0xff7f < addr) && (addr != 0xffff)) {
            return mmu->hram[(int)(addr - 0xff80)];
          }
          return 0xff;
        }
        uVar2 = ppu_obp1_read(&pgVar1->ppu);
        return uVar2;
      }
      uVar2 = ppu_stat_read(&pgVar1->ppu);
      return uVar2;
    }
  }
  if ((addr < 0x100) && ((mmu->bootrom_mapped & 1U) != 0)) {
    mmu_local._7_1_ = gb_bootrom[addr];
  }
  else if (mmu->cart == (gb_cart *)0x0) {
    mmu_local._7_1_ = 0xff;
  }
  else {
    mmu_local._7_1_ = cart_read(mmu->cart,addr);
  }
  return mmu_local._7_1_;
}

Assistant:

uint8_t mmu_read(gb_mmu_t *mmu, uint16_t addr)
{
    assert(mmu != NULL);

    gb_t *gb = mmu->gb;

    switch (addr & 0xF000)
    {
    case 0x0000:
    case 0x1000:
    case 0x2000:
    case 0x3000:
    case 0x4000:
    case 0x5000:
    case 0x6000:
    case 0x7000:
    case 0xA000:
    case 0xB000:
        if (addr < 0x100 && mmu->bootrom_mapped)
            return gb_bootrom[addr];
        else
        {
            // ROM and external RAM requests are redirected to the cartridge
            if (mmu->cart == NULL)
                return 0xFF;
            else
                return cart_read(mmu->cart, addr);
        }

    case 0x8000:
    case 0x9000:
        // VRAM
        return ppu_vram_read(&gb->ppu, addr);

    case 0xC000:
    case 0xD000:
        // Internal RAM
        return mmu->ram[addr - 0xC000];
    
    case 0xE000:
        // unused
        return 0xFF;

    case 0xF000:
        switch (addr & 0xF00)
        {
        case 0x000:
        case 0x100:
        case 0x200:
        case 0x300:
        case 0x400:
        case 0x500:
        case 0x600:
        case 0x700:
        case 0x800:
        case 0x900:
        case 0xA00:
        case 0xB00:
        case 0xC00:
        case 0xD00:
            // unused
            return 0xFF;
        
        case 0xE00:
            if (addr >= 0xFEA0)
            {
                // unused
                return 0xFF;
            }
            
            // OAM
            return ppu_oam_read(&gb->ppu, addr);

        case 0xF00:
            switch (addr & 0xFF)
            {
            case 0x0F:
                // IF (interrupt controller)
                return int_if_read(&gb->intr_ctrl);

            case 0xFF:
                // IE (interrupt controller)
                return int_ie_read(&gb->intr_ctrl);

            case 0x00:
                // JOYP (Joypad)
                return joypad_joyp_read(&gb->joypad);

            case 0x04:
                // DIV (timer)
                return timer_div_read(&gb->timer);

            case 0x05:
                // TIMA (timer)
                return timer_tima_read(&gb->timer);

            case 0x06:
                // TMA (timer)
                return timer_tma_read(&gb->timer);

            case 0x07:
                // TAC (timer)
                return timer_tac_read(&gb->timer);

            case 0x40:
                // LCDC (PPU)
                return ppu_lcdc_read(&gb->ppu);

            case 0x41:
                // STAT (PPU)
                return ppu_stat_read(&gb->ppu);

            case 0x42:
                // SCY (PPU)
                return ppu_scy_read(&gb->ppu);
            case 0x43:
                // SCX (PPU)
                return ppu_scx_read(&gb->ppu);

            case 0x44:
                // LY (PPU)
                return ppu_ly_read(&gb->ppu);

            case 0x45:
                // LYC (PPU)
                return ppu_lyc_read(&gb->ppu);

            case 0x47:
                // BGP (PPU)
                return ppu_bgp_read(&gb->ppu);

            case 0x48:
                // OBP0 (PPU)
                return ppu_obp0_read(&gb->ppu);

            case 0x49:
                // OBP1 (PPU)
                return ppu_obp1_read(&gb->ppu);

            case 0x4A:
                // WY (PPU)
                return ppu_wy_read(&gb->ppu);

            case 0x4B:
                // WX (PPU)
                return ppu_wx_read(&gb->ppu);

            case 0x46:
                // DMA (PPU)
                return ppu_dma_read(&gb->ppu);

            default:
                if (addr >= 0xFF80 && addr < 0xFFFF)
                    return mmu->hram[addr - 0xFF80];
                else
                    return 0xFF;
            }

        default:
            return 0xFF;
        }
    
    default:
        return 0xFF;
    }
}